

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::App::check_name(App *this,string *name_to_check)

{
  __type _Var1;
  string local_c8;
  string local_a8;
  string local_78;
  string local_58;
  undefined1 local_38 [8];
  string local_name;
  string *name_to_check_local;
  App *this_local;
  
  local_name.field_2._8_8_ = name_to_check;
  ::std::__cxx11::string::string((string *)local_38,(string *)&this->name_);
  if ((this->ignore_case_ & 1U) != 0) {
    ::std::__cxx11::string::string((string *)&local_78,(string *)&this->name_);
    detail::to_lower(&local_58,&local_78);
    ::std::__cxx11::string::operator=((string *)local_38,(string *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::string((string *)&local_c8,(string *)name_to_check);
    detail::to_lower(&local_a8,&local_c8);
    ::std::__cxx11::string::operator=((string *)name_to_check,(string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string((string *)&local_c8);
  }
  _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,name_to_check);
  ::std::__cxx11::string::~string((string *)local_38);
  return _Var1;
}

Assistant:

bool check_name(std::string name_to_check) const {
        std::string local_name = name_;
        if(ignore_case_) {
            local_name = detail::to_lower(name_);
            name_to_check = detail::to_lower(name_to_check);
        }

        return local_name == name_to_check;
    }